

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_utils.c
# Opt level: O0

void set_encoding_params_for_screen_content(AV1_COMP *cpi,int pass)

{
  AV1_COMMON *cm;
  int pass_local;
  AV1_COMP *cpi_local;
  
  if (pass == 0) {
    (cpi->common).features.allow_screen_content_tools = false;
    (cpi->common).features.allow_intrabc = false;
    cpi->use_screen_content_tools = 0;
    (cpi->sf).part_sf.partition_search_type = '\x01';
    (cpi->sf).part_sf.fixed_partition_size = BLOCK_32X32;
  }
  else {
    (cpi->common).features.allow_screen_content_tools = true;
    cpi->use_screen_content_tools = 1;
    (cpi->sf).part_sf.partition_search_type = '\x01';
    (cpi->sf).part_sf.fixed_partition_size = BLOCK_32X32;
  }
  return;
}

Assistant:

static void set_encoding_params_for_screen_content(AV1_COMP *cpi,
                                                   const int pass) {
  AV1_COMMON *const cm = &cpi->common;
  if (pass == 0) {
    // In the first pass, encode without screen content tools.
    // Use a high q, and a fixed block size for fast encoding.
    cm->features.allow_screen_content_tools = 0;
    cm->features.allow_intrabc = 0;
    cpi->use_screen_content_tools = 0;
    cpi->sf.part_sf.partition_search_type = FIXED_PARTITION;
    cpi->sf.part_sf.fixed_partition_size = BLOCK_32X32;
    return;
  }
  assert(pass == 1);
  // In the second pass, encode with screen content tools.
  // Use a high q, and a fixed block size for fast encoding.
  cm->features.allow_screen_content_tools = 1;
  // TODO(chengchen): turn intrabc on could lead to data race issue.
  // cm->allow_intrabc = 1;
  cpi->use_screen_content_tools = 1;
  cpi->sf.part_sf.partition_search_type = FIXED_PARTITION;
  cpi->sf.part_sf.fixed_partition_size = BLOCK_32X32;
}